

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O1

void __thiscall
randomx::AssemblyGeneratorX86::h_FADD_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *puVar1;
  char *pcVar2;
  size_t sVar3;
  
  instr->dst = instr->dst & 3;
  instr->src = instr->src & 3;
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\taddpd ",7);
  pcVar2 = *(char **)(regF + (ulong)instr->dst * 8);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", ",2);
  pcVar2 = *(char **)(regA + (ulong)instr->src * 8);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar2,sVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + (char)puVar1);
  std::ostream::put((char)puVar1);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FADD_R(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		instr.src %= RegisterCountFlt;
		asmCode << "\taddpd " << regF[instr.dst] << ", " << regA[instr.src] << std::endl;
		traceflt(instr);
	}